

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O0

void onmt::unicode::
     character_iterator<onmt::unicode::explode_utf8(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<int,std::allocator<int>>&)::__0>
               (string *str,anon_class_16_2_a35bce61 *callback)

{
  code_point_t code_point_00;
  char *str_00;
  anon_class_16_2_a35bce61 *in_RSI;
  code_point_t code_point;
  size_t char_size;
  char *c_str;
  size_t length;
  
  str_00 = (char *)std::__cxx11::string::c_str();
  while (*str_00 != '\0') {
    length = 0;
    code_point_00 = utf8_to_cp(str_00,(size_t *)&stack0xffffffffffffffe0);
    if (code_point_00 == 0) {
      str_00 = str_00 + 1;
    }
    else {
      explode_utf8::anon_class_16_2_a35bce61::operator()(in_RSI,str_00,length,code_point_00);
      str_00 = str_00 + length;
    }
  }
  return;
}

Assistant:

static inline void character_iterator(const std::string& str, const Callback& callback)
    {
      const char* c_str = str.c_str();
      while (*c_str)
      {
        size_t char_size = 0;
        code_point_t code_point = utf8_to_cp(c_str, &char_size);

        if (code_point == 0)  // Ignore invalid code points.
        {
          c_str++;
          continue;
        }

        callback(c_str, char_size, code_point);
        c_str += char_size;
      }
    }